

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_cast.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundCastExpression *cast,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  Optimizer *in_RAX;
  type stats;
  pointer pEVar1;
  pointer this_00;
  pointer *__ptr;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> child_stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_28;
  
  local_28._M_head_impl = (BaseStatistics *)in_RAX;
  PropagateExpression((StatisticsPropagator *)&stack0xffffffffffffffd8,
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)cast);
  if ((Optimizer *)local_28._M_head_impl == (Optimizer *)0x0) {
    this->optimizer = (Optimizer *)0x0;
  }
  else {
    stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       *)&stack0xffffffffffffffd8);
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr_ptr + 0xb);
    TryPropagateCast(this,stats,&pEVar1->return_type,(LogicalType *)(expr_ptr + 7));
    if ((*(char *)&expr_ptr[0xc].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == '\x01') &&
       (this->optimizer != (Optimizer *)0x0)) {
      this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                              *)this);
      BaseStatistics::Set(this_00,CAN_HAVE_NULL_VALUES);
    }
  }
  if ((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
      local_28._M_head_impl !=
      (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0) {
    BaseStatistics::~BaseStatistics(local_28._M_head_impl);
    operator_delete(local_28._M_head_impl);
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundCastExpression &cast,
                                                                     unique_ptr<Expression> &expr_ptr) {
	auto child_stats = PropagateExpression(cast.child);
	if (!child_stats) {
		return nullptr;
	}
	auto result_stats = TryPropagateCast(*child_stats, cast.child->return_type, cast.return_type);
	if (cast.try_cast && result_stats) {
		result_stats->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
	}
	return result_stats;
}